

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O3

void __thiscall Imf_3_4::ChannelList::insert(ChannelList *this,char *name,Channel *channel)

{
  undefined8 uVar1;
  int iVar2;
  mapped_type *pmVar3;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  key_type local_1a0;
  
  if (*name != '\0') {
    strncpy(local_1a0._text,name,0xff);
    local_1a0._text[0xff] = '\0';
    pmVar3 = std::
             map<Imf_3_4::Name,_Imf_3_4::Channel,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
             ::operator[](&this->_map,&local_1a0);
    iVar2 = channel->xSampling;
    uVar1 = *(undefined8 *)((long)&channel->xSampling + 1);
    pmVar3->type = channel->type;
    pmVar3->xSampling = iVar2;
    *(undefined8 *)((long)&pmVar3->xSampling + 1) = uVar1;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0._text + 0x10),"Image channel name cannot be an empty string.",
             0x2d);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
ChannelList::insert (const char name[], const Channel& channel)
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image channel name cannot be an empty string.");

    _map[name] = channel;
}